

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

optional<webfront::fs::File> * __thiscall
webfront::fs::
Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>
::openFile<webfront::fs::ReactFS,webfront::fs::BabelFS>
          (Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>
           *this,path *filename)

{
  bool bVar1;
  path *in_RDX;
  path *in_RDI;
  optional<webfront::fs::File> file;
  optional<webfront::fs::File> *in_stack_fffffffffffffcf8;
  path *this_00;
  undefined1 local_2a0 [40];
  char local_278 [552];
  path *in_stack_ffffffffffffffb0;
  Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>
  *in_stack_ffffffffffffffb8;
  
  this_00 = in_RDI;
  http::std::filesystem::__cxx11::path::path(in_RDI,in_RDI);
  ReactFS::open(local_278,(int)local_2a0);
  http::std::filesystem::__cxx11::path::~path(in_RDX);
  bVar1 = http::std::optional<webfront::fs::File>::has_value
                    ((optional<webfront::fs::File> *)0x12cf40);
  if (bVar1) {
    http::std::optional<webfront::fs::File>::optional
              ((optional<webfront::fs::File> *)in_RDX,in_stack_fffffffffffffcf8);
  }
  else {
    http::std::filesystem::__cxx11::path::path(this_00,in_RDI);
    Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>
    ::openFile<webfront::fs::BabelFS>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    http::std::filesystem::__cxx11::path::~path(in_RDX);
  }
  http::std::optional<webfront::fs::File>::~optional((optional<webfront::fs::File> *)0x12cff6);
  return (optional<webfront::fs::File> *)this_00;
}

Assistant:

std::optional<File> openFile(std::filesystem::path filename) {
        auto file = this->First::open(filename);
        if constexpr (sizeof...(Rest) == 0) return file;
        else {
            if (file.has_value()) return file;
            return openFile<Rest...>(filename);
        }
    }